

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_duplicate_set.c
# Opt level: O0

oonf_duplicate_result
oonf_duplicate_test(oonf_duplicate_set *set,uint8_t msg_type,netaddr *originator,uint64_t seqno)

{
  oonf_log_source oVar1;
  oonf_duplicate_result oVar2;
  long lVar3;
  undefined8 uVar4;
  oonf_duplicate_entry *local_d0;
  undefined1 local_c6 [8];
  netaddr_str nbuf;
  oonf_duplicate_result result;
  oonf_duplicate_entry_key key;
  oonf_duplicate_entry *entry;
  uint64_t seqno_local;
  netaddr *originator_local;
  uint8_t msg_type_local;
  oonf_duplicate_set *set_local;
  
  unique0x00012000 = *(undefined8 *)originator->_addr;
  lVar3 = avl_find(set,nbuf.buf + 0x3b);
  if (lVar3 == 0) {
    local_d0 = (oonf_duplicate_entry *)0x0;
  }
  else {
    local_d0 = (oonf_duplicate_entry *)(lVar3 + -0x38);
  }
  if (local_d0 == (oonf_duplicate_entry *)0x0) {
    nbuf.buf[0x36] = '\x05';
    nbuf.buf[0x37] = '\0';
    nbuf.buf[0x38] = '\0';
    nbuf.buf[0x39] = '\0';
  }
  else {
    nbuf.buf._54_4_ = _test(set,local_d0,seqno,false);
  }
  oVar1 = _oonf_duplicate_set_subsystem.logging;
  if (((&log_global_mask)[_oonf_duplicate_set_subsystem.logging] & 1) != 0) {
    uVar4 = netaddr_to_prefixstring(local_c6,originator,0);
    oonf_log(1,oVar1,"src/base/oonf_duplicate_set.c",0x10a,0,0,
             "Test msgtype %u, originator %s, seqno %lu: %s",msg_type,uVar4,seqno,
             OONF_DUPSET_RESULT_STR[(uint)nbuf.buf._54_4_]);
  }
  oVar2._0_1_ = nbuf.buf[0x36];
  oVar2._1_1_ = nbuf.buf[0x37];
  oVar2._2_1_ = nbuf.buf[0x38];
  oVar2._3_1_ = nbuf.buf[0x39];
  return oVar2;
}

Assistant:

enum oonf_duplicate_result
oonf_duplicate_test(struct oonf_duplicate_set *set, uint8_t msg_type, struct netaddr *originator, uint64_t seqno)
{
  struct oonf_duplicate_entry *entry;
  struct oonf_duplicate_entry_key key;
  enum oonf_duplicate_result result;

#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str nbuf;
#endif

  /* generate combined key */
  memcpy(&key.addr, originator, sizeof(*originator));
  key.msg_type = msg_type;

  entry = avl_find_element(&set->_tree, &key, entry, _node);
  if (!entry) {
    result = OONF_DUPSET_FIRST;
  }
  else {
    result = _test(set, entry, seqno, false);
  }

  OONF_DEBUG(LOG_DUPLICATE_SET, "Test msgtype %u, originator %s, seqno %" PRIu64 ": %s", msg_type,
    netaddr_to_string(&nbuf, originator), seqno, OONF_DUPSET_RESULT_STR[result]);

  return result;
}